

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

void ctl_refresh(tsdn_t *tsdn)

{
  background_thread_stats_t *stats;
  undefined8 uVar1;
  undefined8 uVar2;
  ctl_arena_t *ctl_sdarena;
  ctl_arena_stats_t *pcVar3;
  arena_t *arena;
  long lVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  ctl_stats_t *pcVar11;
  uint32_t uVar12;
  atomic_u32_t aVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  ctl_stats_t *pcVar20;
  _Bool _Var21;
  int iVar22;
  tsd_t *tsd;
  ulong uVar23;
  ctl_arena_t *pcVar24;
  void *pvVar25;
  ulong uVar26;
  uint i;
  size_t sVar27;
  undefined1 auVar28 [16];
  long alStack_40 [2];
  
  uVar26 = (ulong)ctl_arenas->narenas;
  alStack_40[0] = 0x1c67d5f;
  tsd = (tsd_t *)__tls_get_addr(&PTR_024d8b58);
  if ((tsd->state).repr != '\0') {
    alStack_40[0] = 0x1c68013;
    duckdb_je_tsd_fetch_slow(tsd,false);
  }
  ctl_sdarena = ctl_arenas->duckdb_je_arenas[0];
  lVar4 = -(uVar26 * 8 + 0xf & 0xfffffffffffffff0);
  ctl_sdarena->nthreads = 0;
  ctl_sdarena->dss = "N/A";
  *(undefined4 *)&ctl_sdarena->dirty_decay_ms = 0xffffffff;
  *(undefined4 *)((long)&ctl_sdarena->dirty_decay_ms + 4) = 0xffffffff;
  *(undefined4 *)&ctl_sdarena->muzzy_decay_ms = 0xffffffff;
  *(undefined4 *)((long)&ctl_sdarena->muzzy_decay_ms + 4) = 0xffffffff;
  ctl_sdarena->pactive = 0;
  ctl_sdarena->pdirty = 0;
  ctl_sdarena->pmuzzy = 0;
  pcVar3 = ctl_sdarena->astats;
  *(undefined8 *)((long)alStack_40 + lVar4) = 0x1c67dcf;
  switchD_0105b559::default(pcVar3,0,0x9818);
  if (uVar26 != 0) {
    uVar23 = 0;
    do {
      pvVar25 = duckdb_je_arenas[uVar23].repr;
      if (pvVar25 == (void *)0x0) {
        pvVar25 = (void *)0x0;
      }
      *(void **)((long)alStack_40 + uVar23 * 8 + lVar4 + -0x38 + 0x40) = pvVar25;
      uVar23 = uVar23 + 1;
    } while (uVar26 != uVar23);
    sVar27 = 0;
    do {
      *(undefined8 *)((long)alStack_40 + lVar4) = 0x1c67e04;
      pcVar24 = arenas_i(sVar27);
      arena = *(arena_t **)((long)alStack_40 + sVar27 * 8 + lVar4 + -0x38 + 0x40);
      pcVar24->initialized = arena != (arena_t *)0x0;
      if (arena != (arena_t *)0x0) {
        *(undefined8 *)((long)alStack_40 + lVar4) = 0x1c67e23;
        ctl_arena_refresh(tsdn,arena,ctl_sdarena,(uint)sVar27,false);
      }
      sVar27 = sVar27 + 1;
    } while (uVar26 != sVar27);
  }
  pcVar11 = ctl_stats;
  pcVar3 = ctl_sdarena->astats;
  ctl_stats->allocated = (pcVar3->astats).allocated_large + pcVar3->allocated_small;
  pcVar11->active = ctl_sdarena->pactive << 0xc;
  pcVar11->metadata = (pcVar3->astats).internal.repr + (pcVar3->astats).base;
  sVar27 = (pcVar3->astats).metadata_rtree;
  pcVar11->metadata_edata = (pcVar3->astats).metadata_edata;
  pcVar11->metadata_rtree = sVar27;
  uVar1 = (pcVar3->astats).resident;
  uVar2 = (pcVar3->astats).metadata_thp;
  auVar28._8_4_ = (int)uVar1;
  auVar28._0_8_ = uVar2;
  auVar28._12_4_ = (int)((ulong)uVar1 >> 0x20);
  pcVar11->metadata_thp = uVar2;
  pcVar11->resident = auVar28._8_8_;
  pcVar11->mapped = (pcVar3->astats).mapped;
  pcVar11->retained = (pcVar3->astats).pa_shard_stats.pac_stats.retained;
  stats = &pcVar11->background_thread;
  *(undefined8 *)((long)alStack_40 + lVar4) = 0x1c67e96;
  _Var21 = duckdb_je_background_thread_stats_read(tsdn,stats);
  if (_Var21) {
    (pcVar11->background_thread).max_counter_per_bg_thd.n_owner_switches = 0;
    (pcVar11->background_thread).max_counter_per_bg_thd.prev_owner = (tsdn_t *)0x0;
    (pcVar11->background_thread).max_counter_per_bg_thd.n_spin_acquired = 0;
    (pcVar11->background_thread).max_counter_per_bg_thd.max_n_thds = 0;
    (pcVar11->background_thread).max_counter_per_bg_thd.n_waiting_thds = 0;
    (pcVar11->background_thread).max_counter_per_bg_thd.max_wait_time = 0;
    (pcVar11->background_thread).max_counter_per_bg_thd.n_wait_times = 0;
    (pcVar11->background_thread).run_interval = 0;
    (pcVar11->background_thread).max_counter_per_bg_thd.tot_wait_time = 0;
    stats->num_threads = 0;
    stats->num_runs = 0;
    (pcVar11->background_thread).max_counter_per_bg_thd.n_lock_ops = 0;
    *(undefined8 *)((long)alStack_40 + lVar4) = 0x1c67ed3;
    duckdb_je_nstime_copy(&(pcVar11->background_thread).run_interval,&nstime_zero);
  }
  pcVar20 = ctl_stats;
  uVar5 = (pcVar11->background_thread).max_counter_per_bg_thd.tot_wait_time.ns;
  uVar6 = (pcVar11->background_thread).max_counter_per_bg_thd.max_wait_time.ns;
  uVar7 = (pcVar11->background_thread).max_counter_per_bg_thd.n_wait_times;
  uVar8 = (pcVar11->background_thread).max_counter_per_bg_thd.n_spin_acquired;
  uVar12 = (pcVar11->background_thread).max_counter_per_bg_thd.max_n_thds;
  aVar13.repr = (pcVar11->background_thread).max_counter_per_bg_thd.n_waiting_thds.repr;
  uVar9 = (pcVar11->background_thread).max_counter_per_bg_thd.n_owner_switches;
  uVar10 = (pcVar11->background_thread).max_counter_per_bg_thd.n_lock_ops;
  ctl_stats->mutex_prof_data[1].prev_owner =
       (pcVar11->background_thread).max_counter_per_bg_thd.prev_owner;
  pcVar20->mutex_prof_data[1].n_lock_ops = uVar10;
  pcVar20->mutex_prof_data[1].max_n_thds = uVar12;
  pcVar20->mutex_prof_data[1].n_waiting_thds = (atomic_u32_t)aVar13.repr;
  pcVar20->mutex_prof_data[1].n_owner_switches = uVar9;
  pcVar20->mutex_prof_data[1].n_wait_times = uVar7;
  pcVar20->mutex_prof_data[1].n_spin_acquired = uVar8;
  pcVar20->mutex_prof_data[1].tot_wait_time.ns = uVar5;
  pcVar20->mutex_prof_data[1].max_wait_time.ns = uVar6;
  pcVar20->mutex_prof_data[1].n_waiting_thds.repr = 0;
  *(undefined8 *)((long)alStack_40 + lVar4) = 0x1c67f2d;
  iVar22 = pthread_mutex_trylock
                     ((pthread_mutex_t *)((long)&duckdb_je_background_thread_lock.field_0 + 0x48));
  if (iVar22 != 0) {
    *(undefined8 *)((long)alStack_40 + lVar4) = 0x1c67f39;
    duckdb_je_malloc_mutex_lock_slow(&duckdb_je_background_thread_lock);
  }
  pcVar11 = ctl_stats;
  uVar18 = duckdb_je_background_thread_lock.field_0.witness.link.qre_next;
  uVar17 = duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_spin_acquired;
  uVar16 = duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_wait_times;
  uVar15 = duckdb_je_background_thread_lock.field_0.field_0.prof_data.max_wait_time.ns;
  uVar14 = duckdb_je_background_thread_lock.field_0.field_0.prof_data.tot_wait_time.ns;
  duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_lock_ops =
       duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_lock_ops + 1;
  if (duckdb_je_background_thread_lock.field_0.field_0.prof_data.prev_owner != tsdn) {
    duckdb_je_background_thread_lock.field_0.witness.link.qre_prev =
         (witness_t *)
         (duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_owner_switches + 1);
    duckdb_je_background_thread_lock.field_0.field_0.prof_data.prev_owner = tsdn;
  }
  uVar19 = duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_owner_switches;
  ctl_stats->mutex_prof_data[0].prev_owner =
       duckdb_je_background_thread_lock.field_0.field_0.prof_data.prev_owner;
  pcVar11->mutex_prof_data[0].n_lock_ops =
       duckdb_je_background_thread_lock.field_0.field_0.prof_data.n_lock_ops;
  *(undefined8 *)&pcVar11->mutex_prof_data[0].max_n_thds = uVar18;
  pcVar11->mutex_prof_data[0].n_owner_switches = uVar19;
  pcVar11->mutex_prof_data[0].n_wait_times = uVar16;
  pcVar11->mutex_prof_data[0].n_spin_acquired = uVar17;
  pcVar11->mutex_prof_data[0].tot_wait_time.ns = uVar14;
  pcVar11->mutex_prof_data[0].max_wait_time.ns = uVar15;
  pcVar11->mutex_prof_data[0].n_waiting_thds.repr = 0;
  duckdb_je_background_thread_lock.field_0.field_0.locked.repr = (atomic_b_t)false;
  *(undefined8 *)((long)alStack_40 + lVar4) = 0x1c67fa7;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&duckdb_je_background_thread_lock.field_0 + 0x48));
  pcVar11 = ctl_stats;
  uVar14 = ctl_mtx.field_0.field_0.prof_data.max_wait_time.ns;
  ctl_stats->mutex_prof_data[2].tot_wait_time.ns =
       (uint64_t)ctl_mtx.field_0.field_0.prof_data.tot_wait_time.ns;
  pcVar11->mutex_prof_data[2].max_wait_time.ns = uVar14;
  uVar14 = ctl_mtx.field_0.field_0.prof_data.n_spin_acquired;
  pcVar11->mutex_prof_data[2].n_wait_times = ctl_mtx.field_0.field_0.prof_data.n_wait_times;
  pcVar11->mutex_prof_data[2].n_spin_acquired = uVar14;
  uVar14 = ctl_mtx.field_0.field_0.prof_data.n_owner_switches;
  *(witness_t **)&pcVar11->mutex_prof_data[2].max_n_thds = ctl_mtx.field_0.witness.link.qre_next;
  pcVar11->mutex_prof_data[2].n_owner_switches = uVar14;
  uVar14 = ctl_mtx.field_0.field_0.prof_data.n_lock_ops;
  pcVar11->mutex_prof_data[2].prev_owner = ctl_mtx.field_0.field_0.prof_data.prev_owner;
  pcVar11->mutex_prof_data[2].n_lock_ops = uVar14;
  pcVar11->mutex_prof_data[2].n_waiting_thds.repr = 0;
  ctl_arenas->epoch = ctl_arenas->epoch + 1;
  return;
}

Assistant:

static void
ctl_refresh(tsdn_t *tsdn) {
	malloc_mutex_assert_owner(tsdn, &ctl_mtx);
	/*
	 * We are guaranteed that `ctl_arenas->narenas` will not change
	 * underneath us since we hold `ctl_mtx` for the duration of this
	 * function. Unfortunately static analysis tools do not understand this,
	 * so we are extracting `narenas` into a local variable solely for the
	 * sake of exposing this information to such tools.
	 */
	const unsigned narenas = ctl_arenas->narenas;
	assert(narenas > 0);
	ctl_arena_t *ctl_sarena = arenas_i(MALLCTL_ARENAS_ALL);
	VARIABLE_ARRAY_UNSAFE(arena_t *, tarenas, narenas);

	/*
	 * Clear sum stats, since they will be merged into by
	 * ctl_arena_refresh().
	 */
	ctl_arena_clear(ctl_sarena);

	for (unsigned i = 0; i < narenas; i++) {
		tarenas[i] = arena_get(tsdn, i, false);
	}

	for (unsigned i = 0; i < narenas; i++) {
		ctl_arena_t *ctl_arena = arenas_i(i);
		bool initialized = (tarenas[i] != NULL);

		ctl_arena->initialized = initialized;
		if (initialized) {
			ctl_arena_refresh(tsdn, tarenas[i], ctl_sarena, i,
			    false);
		}
	}

	if (config_stats) {
		ctl_stats->allocated = ctl_sarena->astats->allocated_small +
		    ctl_sarena->astats->astats.allocated_large;
		ctl_stats->active = (ctl_sarena->pactive << LG_PAGE);
		ctl_stats->metadata = ctl_sarena->astats->astats.base +
		    atomic_load_zu(&ctl_sarena->astats->astats.internal,
			ATOMIC_RELAXED);
		ctl_stats->metadata_edata = ctl_sarena->astats->astats
		    .metadata_edata;
		ctl_stats->metadata_rtree = ctl_sarena->astats->astats
		    .metadata_rtree;
		ctl_stats->resident = ctl_sarena->astats->astats.resident;
		ctl_stats->metadata_thp =
		    ctl_sarena->astats->astats.metadata_thp;
		ctl_stats->mapped = ctl_sarena->astats->astats.mapped;
		ctl_stats->retained = ctl_sarena->astats->astats
		    .pa_shard_stats.pac_stats.retained;

		ctl_background_thread_stats_read(tsdn);

#define READ_GLOBAL_MUTEX_PROF_DATA(i, mtx)				\
    malloc_mutex_lock(tsdn, &mtx);					\
    malloc_mutex_prof_read(tsdn, &ctl_stats->mutex_prof_data[i], &mtx);	\
    malloc_mutex_unlock(tsdn, &mtx);

		if (config_prof && opt_prof) {
			READ_GLOBAL_MUTEX_PROF_DATA(
			    global_prof_mutex_prof, bt2gctx_mtx);
			READ_GLOBAL_MUTEX_PROF_DATA(
			    global_prof_mutex_prof_thds_data, tdatas_mtx);
			READ_GLOBAL_MUTEX_PROF_DATA(
			    global_prof_mutex_prof_dump, prof_dump_mtx);
			READ_GLOBAL_MUTEX_PROF_DATA(
			    global_prof_mutex_prof_recent_alloc,
			    prof_recent_alloc_mtx);
			READ_GLOBAL_MUTEX_PROF_DATA(
			    global_prof_mutex_prof_recent_dump,
			    prof_recent_dump_mtx);
			READ_GLOBAL_MUTEX_PROF_DATA(
			    global_prof_mutex_prof_stats, prof_stats_mtx);
		}
		if (have_background_thread) {
			READ_GLOBAL_MUTEX_PROF_DATA(
			    global_prof_mutex_background_thread,
			    background_thread_lock);
		} else {
			memset(&ctl_stats->mutex_prof_data[
			    global_prof_mutex_background_thread], 0,
			    sizeof(mutex_prof_data_t));
		}
		/* We own ctl mutex already. */
		malloc_mutex_prof_read(tsdn,
		    &ctl_stats->mutex_prof_data[global_prof_mutex_ctl],
		    &ctl_mtx);
#undef READ_GLOBAL_MUTEX_PROF_DATA
	}
	ctl_arenas->epoch++;
}